

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O0

void __thiscall libtorrent::http_stream::connected(http_stream *this,error_code *e,handler_type *h)

{
  bool bVar1;
  ulong uVar2;
  endpoint *ep;
  http_stream *local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  type local_1c0;
  mutable_buffer local_188;
  allocator<char> local_171;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string endpoint;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> p;
  handler_type *h_local;
  error_code *e_local;
  http_stream *this_local;
  
  bVar1 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar1) {
    if ((this->m_no_connect & 1U) == 0) {
      std::back_insert_iterator<std::vector<char,_std::allocator<char>_>_>::back_insert_iterator
                ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                 ((long)&endpoint.field_2 + 8),&this->m_buffer);
      print_endpoint_abi_cxx11_
                ((string *)local_60,(libtorrent *)&(this->super_proxy_base).m_remote_endpoint,ep);
      std::operator+(&local_a0,"CONNECT ",(string *)local_60);
      std::operator+(&local_80,&local_a0," HTTP/1.0\r\n");
      detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                (&local_80,
                 (back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                 ((long)&endpoint.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+(&local_150,&this->m_user,":");
        std::operator+(&local_130,&local_150,&this->m_password);
        base64encode(&local_110,&local_130);
        std::operator+(&local_f0,"Proxy-Authorization: Basic ",&local_110);
        std::operator+(&local_d0,&local_f0,"\r\n");
        detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  (&local_d0,
                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                   ((long)&endpoint.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"\r\n",&local_171);
      detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                (&local_170,
                 (back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                 ((long)&endpoint.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      local_188 = (mutable_buffer)boost::asio::buffer<char,std::allocator<char>>(&this->m_buffer);
      local_1d0 = handshake1;
      local_1c8 = 0;
      local_1d8 = this;
      std::
      bind<void(libtorrent::http_stream::*)(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&),libtorrent::http_stream*,std::_Placeholder<1>const&,std::function<void(boost::system::error_code_const&)>>
                (&local_1c0,(offset_in_http_stream_to_subr *)&local_1d0,&local_1d8,
                 (_Placeholder<1> *)&std::placeholders::_1,h);
      boost::asio::
      async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
                ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)this,(mutable_buffers_1 *)&local_188,&local_1c0,(type *)0x0);
      std::
      _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
      ::~_Bind(&local_1c0);
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      memset(&p,0,0x18);
      std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&p);
      std::vector<char,_std::allocator<char>_>::swap
                ((vector<char,_std::allocator<char>_> *)&p,&this->m_buffer);
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&p);
      std::function<void_(const_boost::system::error_code_&)>::operator()(h,e);
    }
  }
  return;
}

Assistant:

void http_stream::connected(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		using namespace libtorrent::detail;

		if (m_no_connect)
		{
			std::vector<char>().swap(m_buffer);
			h(e);
			return;
		}

		// send CONNECT
		std::back_insert_iterator<std::vector<char>> p(m_buffer);
		std::string const endpoint = print_endpoint(m_remote_endpoint);
		write_string("CONNECT " + endpoint + " HTTP/1.0\r\n", p);
		if (!m_user.empty())
		{
			write_string("Proxy-Authorization: Basic " + base64encode(
				m_user + ":" + m_password) + "\r\n", p);
		}
		write_string("\r\n", p);
		async_write(m_sock, boost::asio::buffer(m_buffer)
			, std::bind(&http_stream::handshake1, this, _1, std::move(h)));
	}